

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

void crec_alloc(jit_State *J,RecordFFData *rd,CTypeID id)

{
  TRef *pTVar1;
  ushort uVar2;
  CType *pCVar3;
  CTInfo CVar4;
  TRef TVar5;
  TRef TVar6;
  CTSize k;
  CTSize CVar7;
  TRef TVar8;
  int iVar9;
  uint uVar10;
  cTValue *pcVar11;
  uint uVar12;
  ushort uVar13;
  ulong uVar14;
  uint64_t uVar15;
  CTSize in_R8D;
  TValue *sval;
  CTState *pCVar16;
  IRRef1 IVar17;
  CType *pCVar18;
  CTSize sz;
  uint local_70;
  TRef local_6c;
  TValue *local_68;
  RecordFFData *local_60;
  TValue *local_58;
  CTState *local_50;
  TValue tv;
  CTypeID local_3c;
  uint64_t local_38;
  
  pCVar16 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  local_60 = rd;
  CVar4 = lj_ctype_info(pCVar16,id,&sz);
  pCVar18 = pCVar16->tab + id;
  local_50 = pCVar16;
  TVar5 = lj_ir_kint(J,id);
  pCVar16 = local_50;
  if ((CVar4 & 0xf0000000) == 0x20000000) {
    TVar6 = J->base[1];
    if (TVar6 == 0) {
      TVar6 = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
      IVar17 = (IRRef1)TVar6;
      goto LAB_001554f5;
    }
  }
  else {
    if ((0x3ffffff < CVar4) || ((sz != 8 && (sz != 4)))) {
      local_3c = id;
      if ((CVar4 >> 0x14 & 1) == 0) {
        if ((CVar4 & 0xc0000) == 0) {
          TVar6 = 0x7fff;
        }
        else {
          TVar6 = lj_ir_kint(J,sz);
        }
      }
      else {
        TVar6 = J->base[1];
        if ((TVar6 == 0) || (J->base[2] != 0)) goto LAB_00155b1b;
        pcVar11 = local_60->argv + 1;
        local_6c = crec_ct_tv(J,local_50->tab + 9,0,TVar6,pcVar11);
        in_R8D = (CTSize)pcVar11;
        k = lj_ctype_vlsize(pCVar16,pCVar18,0);
        CVar7 = lj_ctype_vlsize(pCVar16,pCVar18,1);
        TVar6 = lj_ir_kint(J,CVar7 - k);
        (J->fold).ins.field_0.ot = 0x3793;
        (J->fold).ins.field_0.op1 = (IRRef1)local_6c;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
        TVar6 = lj_opt_fold(J);
        TVar8 = lj_ir_kint(J,k);
        (J->fold).ins.field_0.ot = 0x3593;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
        TVar6 = lj_opt_fold(J);
        J->base[1] = 0;
      }
      (J->fold).ins.field_0.ot = 0x538a;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
      local_68 = (TValue *)CONCAT44(local_68._4_4_,TVar6);
      (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
      local_6c = lj_opt_fold(J);
      pCVar16 = local_50;
      IVar17 = (IRRef1)local_6c;
      if (((CVar4 >> 0x14 & 1) == 0) && (sz < 0x81)) {
        if ((J->base[1] != 0) &&
           ((J->base[2] == 0 &&
            (iVar9 = lj_cconv_multi_init(local_50,pCVar18,local_60->argv + 1), iVar9 == 0)))) {
LAB_0015578c:
          TVar5 = lj_ir_kint64(J,0x10);
          (J->fold).ins.field_0.ot = 0x2909;
          (J->fold).ins.field_0.op1 = IVar17;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
          TVar6 = lj_opt_fold(J);
          TVar5 = J->base[1];
          if (TVar5 == 0) {
            sval = &tv;
            tv.u64 = 0;
            TVar5 = lj_ir_kint(J,0);
          }
          else {
            sval = local_60->argv + 1;
          }
          crec_ct_tv(J,pCVar18,TVar6,TVar5,sval);
          goto LAB_00155991;
        }
        uVar12 = pCVar18->info >> 0x1c;
        if (uVar12 == 1) {
          uVar2 = pCVar18->sib;
          if (J->base[1] != 0) {
LAB_001557fc:
            uVar14 = 1;
            uVar2 = pCVar18->sib;
LAB_001557ff:
            do {
              do {
                uVar13 = uVar2;
                if (uVar13 == 0) goto LAB_00155991;
                pCVar3 = pCVar16->tab;
                uVar2 = pCVar3[uVar13].sib;
                uVar12 = pCVar3[uVar13].info >> 0x1c;
              } while (uVar12 == 0xb);
              if (uVar12 != 9) goto LAB_00155b1b;
              tv.u64 = 0;
              uVar15 = pCVar3[uVar13].name.gcptr64;
              if (uVar15 != 0) {
                uVar10 = pCVar3[uVar13].info & 0xffff;
                uVar12 = pCVar3[uVar10].info;
                if (((0xfffffff < uVar12) && (uVar12 >> 0x1c != 2)) && (uVar12 >> 0x1c != 5))
                goto LAB_00155b1b;
                local_70 = (uint)uVar14;
                local_38 = uVar15;
                if (J->base[uVar14] == 0) {
                  if ((uVar12 & 0xf0000000) == 0x20000000) {
                    local_68 = (TValue *)CONCAT44(local_68._4_4_,0x7fff);
                  }
                  else {
                    TVar5 = lj_ir_kint(J,0);
                    local_68 = (TValue *)CONCAT44(local_68._4_4_,TVar5);
                  }
                  local_58 = &tv;
                }
                else {
                  local_68 = (TValue *)CONCAT44(local_68._4_4_,J->base[uVar14]);
                  local_58 = local_60->argv + uVar14;
                  local_70 = local_70 + 1;
                }
                TVar5 = lj_ir_kint64(J,(ulong)pCVar3[uVar13].size + 0x10);
                (J->fold).ins.field_0.ot = 0x2909;
                (J->fold).ins.field_0.op1 = (IRRef1)local_6c;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
                TVar5 = lj_opt_fold(J);
                crec_ct_tv(J,pCVar3 + uVar10,TVar5,(TRef)local_68,local_58);
                pCVar16 = local_50;
                if ((pCVar18->info & 0x800000) == 0) {
                  uVar14 = (ulong)local_70;
                  goto LAB_001557ff;
                }
                uVar14 = (ulong)local_70;
                uVar15 = local_38;
                if (pCVar18->size != pCVar3[uVar10].size) goto LAB_00155b1b;
              }
            } while (uVar15 == 0);
            goto LAB_00155991;
          }
          do {
            uVar13 = uVar2;
            if (uVar13 == 0) goto LAB_001557fc;
            pCVar3 = pCVar16->tab;
            uVar2 = pCVar3[uVar13].sib;
            uVar12 = pCVar3[uVar13].info >> 0x1c;
          } while ((uVar12 == 0xb) ||
                  ((uVar12 == 9 &&
                   ((((pCVar3[uVar13].name.gcptr64 == 0 ||
                      (pCVar3[pCVar3[uVar13].info & 0xffff].info < 0x10000000)) ||
                     (uVar12 = pCVar3[pCVar3[uVar13].info & 0xffff].info >> 0x1c, uVar12 == 2)) ||
                    (uVar12 == 5))))));
        }
        else {
          if (uVar12 != 3) goto LAB_0015578c;
          uVar10 = pCVar18->info & 0xffff;
          uVar12 = pCVar16->tab[uVar10].info;
          pCVar18 = pCVar16->tab + uVar10;
          tv.u64 = 0;
          if ((uVar12 < 0x10000000 || (uVar12 & 0xf0000000) == 0x20000000) &&
             (sz <= pCVar18->size << 4)) {
            TVar5 = 0;
            local_68 = &tv;
            uVar14 = 1;
            local_70 = pCVar18->size;
            for (uVar12 = 0; pCVar16 = local_50, uVar12 < sz; uVar12 = uVar12 + local_70) {
              local_58 = (TValue *)CONCAT44(local_58._4_4_,TVar5);
              TVar5 = lj_ir_kint64(J,(ulong)uVar12 + 0x10);
              (J->fold).ins.field_0.ot = 0x2909;
              (J->fold).ins.field_0.op1 = (IRRef1)local_6c;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
              TVar6 = lj_opt_fold(J);
              pTVar1 = J->base + uVar14;
              if (*pTVar1 == 0) {
                if ((int)uVar14 == 2) {
                  uVar14 = 2;
                  TVar5 = (TRef)local_58;
                }
                else {
                  TVar5 = 0x7fff;
                  if (pCVar18->info < 0x10000000) {
                    TVar5 = lj_ir_kint(J,0);
                  }
                }
              }
              else {
                local_68 = local_60->argv + uVar14;
                uVar14 = (ulong)((int)uVar14 + 1);
                TVar5 = *pTVar1;
              }
              crec_ct_tv(J,pCVar18,TVar6,TVar5,local_68);
            }
            goto LAB_00155991;
          }
        }
      }
      if (J->base[1] != 0) {
LAB_00155b1b:
        lj_trace_err(J,LJ_TRERR_NYICONV);
      }
      TVar5 = lj_ir_kint64(J,0x10);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = IVar17;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
      TVar6 = lj_opt_fold(J);
      TVar5 = (TRef)local_68;
      if ((TRef)local_68 == 0x7fff) {
        TVar5 = lj_ir_kint(J,sz);
      }
      TVar8 = lj_ir_kint(J,0);
      crec_fill(J,TVar6,TVar5,TVar8,in_R8D);
LAB_00155991:
      TVar5 = local_6c;
      *J->base = local_6c;
      pcVar11 = lj_ctype_meta(pCVar16,local_3c,MM_gc);
      if (pcVar11 == (cTValue *)0x0) {
        return;
      }
      crec_finalizer(J,TVar5,0,pcVar11);
      return;
    }
    TVar6 = J->base[1];
    if (TVar6 == 0) {
      if (sz == 4) {
        TVar6 = lj_ir_kint(J,0);
        IVar17 = (IRRef1)TVar6;
      }
      else {
        TVar6 = lj_ir_kint64(J,0);
        IVar17 = (IRRef1)TVar6;
      }
      goto LAB_001554f5;
    }
  }
  TVar6 = crec_ct_tv(J,pCVar18,0,TVar6,local_60->argv + 1);
  IVar17 = (IRRef1)TVar6;
LAB_001554f5:
  (J->fold).ins.field_0.ot = 0x548a;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
  (J->fold).ins.field_0.op2 = IVar17;
  TVar5 = lj_opt_fold(J);
  *J->base = TVar5;
  return;
}

Assistant:

static void crec_alloc(jit_State *J, RecordFFData *rd, CTypeID id)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTSize sz;
  CTInfo info = lj_ctype_info(cts, id, &sz);
  CType *d = ctype_raw(cts, id);
  TRef trcd, trid = lj_ir_kint(J, id);
  cTValue *fin;
  /* Use special instruction to box pointer or 32/64 bit integer. */
  if (ctype_isptr(info) || (ctype_isinteger(info) && (sz == 4 || sz == 8))) {
    TRef sp = J->base[1] ? crec_ct_tv(J, d, 0, J->base[1], &rd->argv[1]) :
	      ctype_isptr(info) ? lj_ir_kptr(J, NULL) :
	      sz == 4 ? lj_ir_kint(J, 0) :
	      (lj_needsplit(J), lj_ir_kint64(J, 0));
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA), trid, sp);
    return;
  } else {
    TRef trsz = TREF_NIL;
    if ((info & CTF_VLA)) {  /* Calculate VLA/VLS size at runtime. */
      CTSize sz0, sz1;
      if (!J->base[1] || J->base[2])
	lj_trace_err(J, LJ_TRERR_NYICONV);  /* NYI: init VLA/VLS. */
      trsz = crec_ct_tv(J, ctype_get(cts, CTID_INT32), 0,
			J->base[1], &rd->argv[1]);
      sz0 = lj_ctype_vlsize(cts, d, 0);
      sz1 = lj_ctype_vlsize(cts, d, 1);
      trsz = emitir(IRTGI(IR_MULOV), trsz, lj_ir_kint(J, (int32_t)(sz1-sz0)));
      trsz = emitir(IRTGI(IR_ADDOV), trsz, lj_ir_kint(J, (int32_t)sz0));
      J->base[1] = 0;  /* Simplify logic below. */
    } else if (ctype_align(info) > CT_MEMALIGN) {
      trsz = lj_ir_kint(J, sz);
    }
    trcd = emitir(IRTG(IR_CNEW, IRT_CDATA), trid, trsz);
    if (sz > 128 || (info & CTF_VLA)) {
      TRef dp;
      CTSize align;
    special:  /* Only handle bulk zero-fill for large/VLA/VLS types. */
      if (J->base[1])
	lj_trace_err(J, LJ_TRERR_NYICONV);  /* NYI: init large/VLA/VLS types. */
      dp = emitir(IRT(IR_ADD, IRT_PTR), trcd, lj_ir_kintp(J, sizeof(GCcdata)));
      if (trsz == TREF_NIL) trsz = lj_ir_kint(J, sz);
      align = ctype_align(info);
      if (align < CT_MEMALIGN) align = CT_MEMALIGN;
      crec_fill(J, dp, trsz, lj_ir_kint(J, 0), (1u << align));
    } else if (J->base[1] && !J->base[2] &&
	!lj_cconv_multi_init(cts, d, &rd->argv[1])) {
      goto single_init;
    } else if (ctype_isarray(d->info)) {
      CType *dc = ctype_rawchild(cts, d);  /* Array element type. */
      CTSize ofs, esize = dc->size;
      TRef sp = 0;
      TValue tv;
      TValue *sval = &tv;
      MSize i;
      tv.u64 = 0;
      if (!(ctype_isnum(dc->info) || ctype_isptr(dc->info)) ||
	  esize * CREC_FILL_MAXUNROLL < sz)
	goto special;
      for (i = 1, ofs = 0; ofs < sz; ofs += esize) {
	TRef dp = emitir(IRT(IR_ADD, IRT_PTR), trcd,
			 lj_ir_kintp(J, ofs + sizeof(GCcdata)));
	if (J->base[i]) {
	  sp = J->base[i];
	  sval = &rd->argv[i];
	  i++;
	} else if (i != 2) {
	  sp = ctype_isnum(dc->info) ? lj_ir_kint(J, 0) : TREF_NIL;
	}
	crec_ct_tv(J, dc, dp, sp, sval);
      }
    } else if (ctype_isstruct(d->info)) {
      CTypeID fid;
      MSize i = 1;
      if (!J->base[1]) {  /* Handle zero-fill of struct-of-NYI. */
	fid = d->sib;
	while (fid) {
	  CType *df = ctype_get(cts, fid);
	  fid = df->sib;
	  if (ctype_isfield(df->info)) {
	    CType *dc;
	    if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
	    dc = ctype_rawchild(cts, df);  /* Field type. */
	    if (!(ctype_isnum(dc->info) || ctype_isptr(dc->info) ||
		  ctype_isenum(dc->info)))
	      goto special;
	  } else if (!ctype_isconstval(df->info)) {
	    goto special;
	  }
	}
      }
      fid = d->sib;
      while (fid) {
	CType *df = ctype_get(cts, fid);
	fid = df->sib;
	if (ctype_isfield(df->info)) {
	  CType *dc;
	  TRef sp, dp;
	  TValue tv;
	  TValue *sval = &tv;
	  setintV(&tv, 0);
	  if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
	  dc = ctype_rawchild(cts, df);  /* Field type. */
	  if (!(ctype_isnum(dc->info) || ctype_isptr(dc->info) ||
		ctype_isenum(dc->info)))
	    lj_trace_err(J, LJ_TRERR_NYICONV);  /* NYI: init aggregates. */
	  if (J->base[i]) {
	    sp = J->base[i];
	    sval = &rd->argv[i];
	    i++;
	  } else {
	    sp = ctype_isptr(dc->info) ? TREF_NIL : lj_ir_kint(J, 0);
	  }
	  dp = emitir(IRT(IR_ADD, IRT_PTR), trcd,
		      lj_ir_kintp(J, df->size + sizeof(GCcdata)));
	  crec_ct_tv(J, dc, dp, sp, sval);
	  if ((d->info & CTF_UNION)) {
	    if (d->size != dc->size)  /* NYI: partial init of union. */
	      lj_trace_err(J, LJ_TRERR_NYICONV);
	    break;
	  }
	} else if (!ctype_isconstval(df->info)) {
	  /* NYI: init bitfields and sub-structures. */
	  lj_trace_err(J, LJ_TRERR_NYICONV);
	}
      }
    } else {
      TRef dp;
    single_init:
      dp = emitir(IRT(IR_ADD, IRT_PTR), trcd, lj_ir_kintp(J, sizeof(GCcdata)));
      if (J->base[1]) {
	crec_ct_tv(J, d, dp, J->base[1], &rd->argv[1]);
      } else {
	TValue tv;
	tv.u64 = 0;
	crec_ct_tv(J, d, dp, lj_ir_kint(J, 0), &tv);
      }
    }
  }
  J->base[0] = trcd;
  /* Handle __gc metamethod. */
  fin = lj_ctype_meta(cts, id, MM_gc);
  if (fin)
    crec_finalizer(J, trcd, 0, fin);
}